

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O0

exr_result_t DwaCompressor_setupChannelData(DwaCompressor *me)

{
  exr_coding_channel_info_t *peVar1;
  ChannelData *pCVar2;
  size_t sVar3;
  int byte;
  size_t uncSize;
  exr_coding_channel_info_t *curc;
  ChannelData *cd;
  size_t c;
  int i;
  uint8_t *planarUncBuffer [3];
  DwaCompressor *me_local;
  
  for (i = 0; i < 3; i = i + 1) {
    planarUncBuffer[i] = (uint8_t *)0x0;
    if (me->_planarUncBuffer[i] != (uint8_t *)0x0) {
      planarUncBuffer[i] = me->_planarUncBuffer[i];
    }
  }
  for (c = 0; c < (ulong)(long)me->_numChannels; c = c + 1) {
    pCVar2 = me->_channelData + c;
    peVar1 = pCVar2->chan;
    sVar3 = (long)peVar1->width * (long)peVar1->height * (long)peVar1->bytes_per_element;
    pCVar2->planarUncSize = sVar3;
    pCVar2->planarUncBuffer = planarUncBuffer[pCVar2->compression];
    pCVar2->planarUncBufferEnd = pCVar2->planarUncBuffer;
    pCVar2->planarUncRle[0] = pCVar2->planarUncBuffer;
    pCVar2->planarUncRleEnd[0] = pCVar2->planarUncRle[0];
    for (byte = 1; byte < peVar1->bytes_per_element; byte = byte + 1) {
      pCVar2->planarUncRle[byte] = pCVar2->planarUncRle[byte + -1] + peVar1->width * peVar1->height;
      pCVar2->planarUncRleEnd[byte] = pCVar2->planarUncRle[byte];
    }
    pCVar2->planarUncType = (uint)peVar1->data_type;
    if (pCVar2->compression == LOSSY_DCT) {
      pCVar2->planarUncType = EXR_PIXEL_FLOAT;
    }
    else {
      planarUncBuffer[pCVar2->compression] = planarUncBuffer[pCVar2->compression] + sVar3;
    }
  }
  return 0;
}

Assistant:

exr_result_t
DwaCompressor_setupChannelData (DwaCompressor* me)
{
    uint8_t* planarUncBuffer[NUM_COMPRESSOR_SCHEMES];

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        planarUncBuffer[i] = 0;

        if (me->_planarUncBuffer[i])
            planarUncBuffer[i] = me->_planarUncBuffer[i];
    }

    for (size_t c = 0; c < me->_numChannels; ++c)
    {
        ChannelData*                     cd   = me->_channelData + c;
        const exr_coding_channel_info_t* curc = cd->chan;
        size_t                           uncSize;

        uncSize = (size_t) curc->width * (size_t) curc->height *
                  (size_t) curc->bytes_per_element;
        cd->planarUncSize = uncSize;

        cd->planarUncBuffer    = planarUncBuffer[cd->compression];
        cd->planarUncBufferEnd = cd->planarUncBuffer;

        cd->planarUncRle[0]    = cd->planarUncBuffer;
        cd->planarUncRleEnd[0] = cd->planarUncRle[0];

        for (int byte = 1; byte < curc->bytes_per_element; ++byte)
        {
            cd->planarUncRle[byte] =
                cd->planarUncRle[byte - 1] + curc->width * curc->height;

            cd->planarUncRleEnd[byte] = cd->planarUncRle[byte];
        }

        cd->planarUncType = (exr_pixel_type_t) curc->data_type;

        if (cd->compression == LOSSY_DCT)
        {
            cd->planarUncType = EXR_PIXEL_FLOAT;
        }
        else { planarUncBuffer[cd->compression] += uncSize; }
    }

    return EXR_ERR_SUCCESS;
}